

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  uchar **ppuVar1;
  ushort uVar2;
  TrieNode<unsigned_short> *__s;
  uchar *puVar3;
  vector_brodnik<unsigned_char_*> *pvVar4;
  uint uVar5;
  ulong uVar6;
  uint j_1;
  uint j;
  long lVar7;
  size_t index;
  ulong uVar8;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  undefined8 auStack_230 [64];
  
  __s = (TrieNode<unsigned_short> *)operator_new(0x82000);
  uVar8 = 0;
  memset(__s,0,0x82000);
  uVar6 = ((2L << (bucket->_superblock & 0x3f)) -
          ((ulong)bucket->_left_in_superblock * bucket->_block_size + bucket->_left_in_block)) +
          0xffffffc0;
  uVar5 = (uint)uVar6;
  if (0x3f < uVar5) {
    uVar8 = 0;
    do {
      lVar7 = 0;
      do {
        puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,lVar7 + uVar8);
        auStack_230[lVar7] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_0020d97c;
        if (puVar3[depth] == '\0') {
          uVar2 = 0;
        }
        else {
          uVar2 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_2b0[lVar7] = uVar2;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      lVar7 = 0;
      do {
        uVar2 = auStack_2b0[lVar7];
        pvVar4 = (vector_brodnik<unsigned_char_*> *)(__s->buckets)._M_elems[uVar2];
        if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
          pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar4->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vector_brodnik<unsigned_char_*>::clear(pvVar4);
          (__s->buckets)._M_elems[uVar2] = pvVar4;
        }
        if (pvVar4->_left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar4);
        }
        puVar3 = (uchar *)auStack_230[lVar7];
        ppuVar1 = pvVar4->_insertpos;
        pvVar4->_insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar3;
        pvVar4->_left_in_block = pvVar4->_left_in_block - 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      uVar8 = uVar8 + 0x40;
    } while (uVar8 < (uVar5 & 0xffffffc0));
  }
  if ((uint)uVar8 < uVar5) {
    index = uVar8 & 0xffffffff;
    do {
      puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,index);
      if (puVar3 == (uchar *)0x0) {
LAB_0020d97c:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      pvVar4 = (vector_brodnik<unsigned_char_*> *)(__s->buckets)._M_elems[uVar8];
      if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
        pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar4->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vector_brodnik<unsigned_char_*>::clear(pvVar4);
        (__s->buckets)._M_elems[uVar8] = pvVar4;
      }
      if (pvVar4->_left_in_block == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar4);
      }
      ppuVar1 = pvVar4->_insertpos;
      pvVar4->_insertpos = ppuVar1 + 1;
      *ppuVar1 = puVar3;
      pvVar4->_left_in_block = pvVar4->_left_in_block - 1;
      index = index + 1;
    } while (index < (uVar6 & 0xffffffff));
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}